

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_generator_testing.h
# Opt level: O3

pair<const_int,_phmap::priv::NonStandardLayout> * __thiscall
phmap::priv::hash_internal::Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void>::
operator()(pair<const_int,_phmap::priv::NonStandardLayout> *__return_storage_ptr__,
          Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void> *this)

{
  result_type_conflict1 rVar1;
  mt19937_64 *__urng;
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_71;
  param_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  string local_48;
  
  local_70._M_a = 0;
  local_70._M_b = 0x7fffffff;
  __urng = GetSharedRng();
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_70,__urng,&local_70);
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()(&local_48,&local_71);
  local_70 = (param_type)&PTR__NonStandardLayout_00337320;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == &local_48.field_2) {
    local_58._8_4_ = local_48.field_2._8_4_;
    local_58._12_4_ = local_48.field_2._12_4_;
    local_48._M_dataplus._M_p = (pointer)&local_58;
  }
  local_58._M_allocated_capacity._4_4_ = local_48.field_2._M_allocated_capacity._4_4_;
  local_58._M_allocated_capacity._0_4_ = local_48.field_2._M_allocated_capacity._0_4_;
  local_60 = local_48._M_string_length;
  __return_storage_ptr__->first = rVar1;
  (__return_storage_ptr__->second)._vptr_NonStandardLayout =
       (_func_int **)&PTR__NonStandardLayout_00337320;
  (__return_storage_ptr__->second).value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).value.field_2;
  local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_48._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->second).value,local_48._M_dataplus._M_p,
             local_48._M_dataplus._M_p + local_48._M_string_length);
  local_70 = (param_type)&PTR__NonStandardLayout_00337320;
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<K, V> operator()() const {
        return std::pair<K, V>(Generator<typename std::decay<K>::type>()(),
                               Generator<typename std::decay<V>::type>()());
    }